

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O3

uint64_t __thiscall nuraft::timer_helper::get_us(timer_helper *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar1 == 0) {
    lVar2 = std::chrono::_V2::system_clock::now();
    dVar4 = ((double)(lVar2 - (this->t_created_).__d.__r) / 1000000000.0) * 1000000.0;
    uVar3 = (ulong)dVar4;
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    return (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

uint64_t get_us() {
        std::lock_guard<std::mutex> l(lock_);
        auto cur = std::chrono::system_clock::now();
        std::chrono::duration<double> elapsed = cur - t_created_;
        return (uint64_t)(1000000 * elapsed.count());
    }